

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.h
# Opt level: O1

bool __thiscall cmake::IsAKnownSourceExtension(cmake *this,string_view ext)

{
  const_iterator cVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  key_type local_30;
  
  pcVar2 = ext._M_str;
  sVar3 = ext._M_len;
  local_30._M_len = sVar3;
  local_30._M_str = pcVar2;
  cVar1 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->CLikeSourceFileExtensions).unordered._M_h,&local_30);
  bVar4 = true;
  if (cVar1.super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
      _M_cur == (__node_type *)0x0) {
    local_30._M_len = sVar3;
    local_30._M_str = pcVar2;
    cVar1 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->CudaFileExtensions).unordered._M_h,&local_30);
    if (cVar1.super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_30._M_len = sVar3;
      local_30._M_str = pcVar2;
      cVar1 = std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->FortranFileExtensions).unordered._M_h,&local_30);
      if (cVar1.
          super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
          _M_cur == (__node_type *)0x0) {
        local_30._M_len = sVar3;
        local_30._M_str = pcVar2;
        cVar1 = std::
                _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->HipFileExtensions).unordered._M_h,&local_30);
        if (cVar1.
            super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
            _M_cur == (__node_type *)0x0) {
          local_30._M_len = sVar3;
          local_30._M_str = pcVar2;
          cVar1 = std::
                  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&(this->ISPCFileExtensions).unordered._M_h,&local_30);
          bVar4 = cVar1.
                  super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                  ._M_cur != (__node_type *)0x0;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool IsAKnownSourceExtension(cm::string_view ext) const
  {
    return this->CLikeSourceFileExtensions.Test(ext) ||
      this->CudaFileExtensions.Test(ext) ||
      this->FortranFileExtensions.Test(ext) ||
      this->HipFileExtensions.Test(ext) || this->ISPCFileExtensions.Test(ext);
  }